

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_buffering.c
# Opt level: O2

uint64_t bigendian_decode_varlen(uint8_t *bytes,uint_fast8_t n)

{
  uint64_t uVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  
  uVar1 = 0;
  for (uVar2 = 0x38; (uint)((int)CONCAT71(in_register_00000031,n) << 3) + uVar2 != 0x38;
      uVar2 = uVar2 - 8) {
    uVar1 = uVar1 | (ulong)*bytes << (uVar2 & 0x3f);
    bytes = bytes + 1;
  }
  return uVar1;
}

Assistant:

ASCON_INLINE uint64_t
bigendian_decode_varlen(const uint8_t* const bytes, const uint_fast8_t n)
{
    uint64_t x = 0;
    // Unsigned int should be the fastest unsigned on the machine.
    // Using it to avoid warnings about <<-operator with signed value.
    for (unsigned int i = 0; i < n; i++)
    {
        x |= ((uint64_t) bytes[i]) << (56U - 8U * i);
    }
    return x;
}